

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

void __thiscall embree::SubdivMesh::setTessellationRate(SubdivMesh *this,float N)

{
  uint *puVar1;
  
  this->tessellationRate = N;
  puVar1 = &(this->levels).super_RawBufferView.modCounter;
  *puVar1 = *puVar1 + 1;
  (this->levels).super_RawBufferView.modified = true;
  return;
}

Assistant:

void SubdivMesh::setTessellationRate(float N)
  {
    tessellationRate = N;
    levels.setModified();
  }